

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_GlobalMemoryAccountant_stop_Test::~TEST_GlobalMemoryAccountant_stop_Test
          (TEST_GlobalMemoryAccountant_stop_Test *this)

{
  TEST_GROUP_CppUTestGroupGlobalMemoryAccountant::~TEST_GROUP_CppUTestGroupGlobalMemoryAccountant
            (&this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant);
  operator_delete(this,0x98);
  return;
}

Assistant:

TEST(GlobalMemoryAccountant, stop)
{
    TestMemoryAllocator* originalMallocAllocator = getCurrentMallocAllocator();
    TestMemoryAllocator* originalNewAllocator = getCurrentNewAllocator();
    TestMemoryAllocator* originalNewArrayAllocator = getCurrentNewArrayAllocator();

    accountant.start();
    accountant.stop();

    POINTERS_EQUAL(originalMallocAllocator, getCurrentMallocAllocator());
    POINTERS_EQUAL(originalNewAllocator, getCurrentNewAllocator());
    POINTERS_EQUAL(originalNewArrayAllocator, getCurrentNewArrayAllocator());
}